

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall
slang::SVInt::writeTo
          (SVInt *this,SmallVectorBase<char> *buffer,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  uint64_t uVar1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint *puVar6;
  unsigned_long *puVar7;
  logic_error *this_00;
  uint64_t *puVar8;
  size_type sVar9;
  iterator pcVar10;
  char *__first;
  double dVar11;
  double dVar12;
  double __x;
  optional<unsigned_long> oVar13;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  char local_299;
  SVInt local_298;
  uint8_t local_281;
  SVInt local_280;
  char local_270 [4];
  uint local_26c;
  uint local_268;
  uint32_t u;
  uint32_t digit_1;
  logic_t local_249;
  bitwidth_t local_248;
  logic_t x;
  int bitsLeft;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  uint local_178;
  int local_174;
  uint32_t maskAmount;
  uint32_t shiftAmount;
  bool local_168;
  ulong local_160;
  uint64_t digit;
  SVInt quotient_1;
  SVInt remainder_1;
  logic_t local_121;
  undefined1 local_120 [8];
  SVInt divisor;
  SVInt quotient;
  SVInt remainder;
  SVInt local_e0;
  undefined1 local_d0 [8];
  SVInt divisor_1;
  char local_b5 [5];
  undefined1 auStack_b0 [7];
  bool upperOnes;
  anon_class_24_3_ec93f8c0 anyXs;
  anon_class_24_3_ec93f8c0 all;
  uint32_t words;
  bitwidth_t bitsInMsw;
  uint64_t mask;
  size_t startOffset;
  char local_5e [2];
  uint32_t base10Exponent;
  bitwidth_t local_58;
  char local_51;
  bitwidth_t activeBits;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  SVInt tmp;
  bitwidth_t abbreviateThresholdBits_local;
  bool includeBase_local;
  LiteralBase base_local;
  SmallVectorBase<char> *buffer_local;
  SVInt *this_local;
  
  tmp.super_SVIntStorage.bitWidth = abbreviateThresholdBits;
  tmp.super_SVIntStorage._14_1_ = includeBase;
  tmp.super_SVIntStorage._15_1_ = base;
  SVInt((SVInt *)&local_30,this);
  if (((((this->super_SVIntStorage).signFlag & 1U) != 0) &&
      (((this->super_SVIntStorage).unknownFlag & 1U) == 0)) && (bVar3 = isNegative(this), bVar3)) {
    operator-((SVInt *)&activeBits);
    operator=((SVInt *)&local_30,(SVInt *)&activeBits);
    ~SVInt((SVInt *)&activeBits);
    local_51 = '-';
    SmallVectorBase<char>::push_back(buffer,&local_51);
  }
  local_58 = getActiveBits((SVInt *)&local_30);
  if (tmp.super_SVIntStorage.bitWidth < local_58) {
    tmp.super_SVIntStorage._14_1_ = 1;
    tmp.super_SVIntStorage._15_1_ = 2;
  }
  if ((tmp.super_SVIntStorage._14_1_ & 1) != 0) {
    uintToStr(buffer,(this->super_SVIntStorage).bitWidth);
    base10Exponent._3_1_ = 0x27;
    SmallVectorBase<char>::push_back(buffer,(char *)((long)&base10Exponent + 3));
    if (((this->super_SVIntStorage).signFlag & 1U) != 0) {
      base10Exponent._2_1_ = 0x73;
      SmallVectorBase<char>::push_back(buffer,(char *)((long)&base10Exponent + 2));
    }
    switch(tmp.super_SVIntStorage._15_1_) {
    case (BADTYPE)0x0:
      base10Exponent._1_1_ = 0x62;
      SmallVectorBase<char>::push_back(buffer,(char *)((long)&base10Exponent + 1));
      break;
    case (BADTYPE)0x1:
      base10Exponent._0_1_ = 0x6f;
      SmallVectorBase<char>::push_back(buffer,(char *)&base10Exponent);
      break;
    case (BADTYPE)0x2:
      local_5e[1] = 100;
      SmallVectorBase<char>::push_back(buffer,local_5e + 1);
      break;
    case (BADTYPE)0x3:
      local_5e[0] = 'h';
      SmallVectorBase<char>::push_back(buffer,local_5e);
    }
  }
  startOffset._4_4_ = 0;
  mask = SmallVectorBase<char>::size(buffer);
  if (tmp.super_SVIntStorage._15_1_ == '\x02') {
    if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
      if (tmp.super_SVIntStorage.bitWidth < local_58) {
        divisor_1.super_SVIntStorage.signFlag = true;
        divisor_1.super_SVIntStorage.unknownFlag = false;
        divisor_1.super_SVIntStorage._14_2_ = 0;
        dVar11 = ceil((double)(local_58 - tmp.super_SVIntStorage.bitWidth) / log2_10);
        divisor_1.super_SVIntStorage.bitWidth = (bitwidth_t)(long)dVar11;
        puVar6 = std::max<unsigned_int>
                           ((uint *)&divisor_1.super_SVIntStorage.signFlag,
                            &divisor_1.super_SVIntStorage.bitWidth);
        startOffset._4_4_ = *puVar6;
        dVar11 = log2_10;
        dVar12 = ceil((double)startOffset._4_4_ * log2_10);
        SVInt((SVInt *)local_d0,(bitwidth_t)(long)dVar12,10,false);
        SVInt<unsigned_int,void>((SVInt *)&remainder.super_SVIntStorage.bitWidth,startOffset._4_4_);
        pow(&local_e0,__x,dVar11);
        operator=((SVInt *)local_d0,&local_e0);
        ~SVInt(&local_e0);
        ~SVInt((SVInt *)&remainder.super_SVIntStorage.bitWidth);
        SVInt((SVInt *)&quotient.super_SVIntStorage.bitWidth);
        SVInt((SVInt *)&divisor.super_SVIntStorage.bitWidth);
        uVar4 = getNumWords((SVInt *)&local_30);
        uVar5 = getNumWords((SVInt *)local_d0);
        divide((SVInt *)&local_30,uVar4,(SVInt *)local_d0,uVar5,
               (SVInt *)&divisor.super_SVIntStorage.bitWidth,
               (SVInt *)&quotient.super_SVIntStorage.bitWidth);
        operator=((SVInt *)&local_30,(SVInt *)&divisor.super_SVIntStorage.bitWidth);
        ~SVInt((SVInt *)&divisor.super_SVIntStorage.bitWidth);
        ~SVInt((SVInt *)&quotient.super_SVIntStorage.bitWidth);
        ~SVInt((SVInt *)local_d0);
      }
      SVInt((SVInt *)local_120,4,10,false);
      while( true ) {
        SVInt<int,void>((SVInt *)&remainder_1.super_SVIntStorage.bitWidth,0);
        local_121 = operator!=((SVInt *)&local_30,(SVInt *)&remainder_1.super_SVIntStorage.bitWidth)
        ;
        bVar3 = logic_t::operator_cast_to_bool(&local_121);
        ~SVInt((SVInt *)&remainder_1.super_SVIntStorage.bitWidth);
        if (!bVar3) break;
        SVInt((SVInt *)&quotient_1.super_SVIntStorage.bitWidth);
        SVInt((SVInt *)&digit);
        uVar4 = getNumWords((SVInt *)&local_30);
        uVar5 = getNumWords((SVInt *)local_120);
        divide((SVInt *)&local_30,uVar4,(SVInt *)local_120,uVar5,(SVInt *)&digit,
               (SVInt *)&quotient_1.super_SVIntStorage.bitWidth);
        oVar13 = as<unsigned_long,void>((SVInt *)&quotient_1.super_SVIntStorage.bitWidth);
        _maskAmount = oVar13.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_payload;
        local_168 = oVar13.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged;
        puVar7 = std::optional<unsigned_long>::value((optional<unsigned_long> *)&maskAmount);
        local_160 = *puVar7;
        if (9 < local_160) {
          assert::assertFailed
                    ("digit < 10",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
                     ,0x30c,
                     "void slang::SVInt::writeTo(SmallVectorBase<char> &, LiteralBase, bool, bitwidth_t) const"
                    );
        }
        SmallVectorBase<char>::push_back(buffer,"0123456789abcdef" + local_160);
        operator=((SVInt *)&local_30,(SVInt *)&digit);
        ~SVInt((SVInt *)&digit);
        ~SVInt((SVInt *)&quotient_1.super_SVIntStorage.bitWidth);
      }
      ~SVInt((SVInt *)local_120);
    }
    else {
      all.mask._0_4_ = getNumWords((this->super_SVIntStorage).bitWidth,false);
      getTopWordMask(this,(bitwidth_t *)((long)&all.mask + 4),(uint64_t *)&words);
      _auStack_b0 = &all.mask;
      anyXs.this = (SVInt *)&words;
      anyXs.words = (uint32_t *)this;
      anyXs.mask = (uint64_t *)_auStack_b0;
      all.words = (uint32_t *)this;
      all.this = anyXs.this;
      local_b5[4] = writeTo::anon_class_24_3_ec93f8c0::operator()
                              ((anon_class_24_3_ec93f8c0 *)&anyXs.mask,(uint32_t)all.mask,
                               0xffffffffffffffff);
      if (((bool)local_b5[4]) &&
         (bVar3 = writeTo::anon_class_24_3_ec93f8c0::operator()
                            ((anon_class_24_3_ec93f8c0 *)&anyXs.mask,0,0xffffffffffffffff), bVar3))
      {
        local_b5[3] = 0x7a;
        SmallVectorBase<char>::push_back(buffer,local_b5 + 3);
      }
      else if (((local_b5[4] & 1U) == 0) ||
              (bVar3 = writeTo::anon_class_24_3_ec93f8c0::operator()
                                 ((anon_class_24_3_ec93f8c0 *)&anyXs.mask,0,0), !bVar3)) {
        bVar3 = writeTo::anon_class_24_3_ec93f8c0::operator()
                          ((anon_class_24_3_ec93f8c0 *)auStack_b0);
        if (bVar3) {
          local_b5[1] = 0x58;
          SmallVectorBase<char>::push_back(buffer,local_b5 + 1);
        }
        else {
          local_b5[0] = 'Z';
          SmallVectorBase<char>::push_back(buffer,local_b5);
        }
      }
      else {
        local_b5[2] = 0x78;
        SmallVectorBase<char>::push_back(buffer,local_b5 + 2);
      }
    }
  }
  else {
    local_174 = 0;
    local_178 = 0;
    switch(tmp.super_SVIntStorage._15_1_) {
    case (BADTYPE)0x0:
      local_174 = 1;
      local_178 = 1;
      break;
    case (BADTYPE)0x1:
      local_174 = 3;
      local_178 = 7;
      break;
    case (BADTYPE)0x2:
      x.value = '\x01';
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
                 ,&local_219);
      std::operator+(&local_1f8,&local_218,":");
      std::__cxx11::to_string((string *)&bitsLeft,0x324);
      std::operator+(&local_1d8,&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bitsLeft)
      ;
      std::operator+(&local_1b8,&local_1d8,": ");
      std::operator+(&local_198,&local_1b8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_198);
      x.value = '\0';
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    case (BADTYPE)0x3:
      local_174 = 4;
      local_178 = 0xf;
    }
    local_248 = getBitWidth((SVInt *)&local_30);
    SVInt<int,void>((SVInt *)&digit_1,0);
    local_249 = operator!=((SVInt *)&local_30,(SVInt *)&digit_1);
    ~SVInt((SVInt *)&digit_1);
    while( true ) {
      u._3_1_ = local_249.value;
      bVar3 = logic_t::isUnknown(&local_249);
      bVar3 = slang::operator||(u._3_1_,bVar3);
      if (!bVar3) break;
      if ((int)local_248 < local_174) {
        local_178 = (1 << ((byte)local_248 & 0x1f)) - 1;
      }
      puVar8 = getRawData((SVInt *)&local_30);
      aVar2 = local_30;
      local_268 = (uint)*puVar8 & local_178;
      if ((tmp.super_SVIntStorage.field_0.val._5_1_ & 1) == 0) {
        SmallVectorBase<char>::push_back(buffer,"0123456789abcdef" + local_268);
      }
      else {
        uVar4 = getNumWords((this->super_SVIntStorage).bitWidth,false);
        local_26c = (uint)aVar2.pVal[uVar4] & local_178;
        if (local_26c == 0) {
          SmallVectorBase<char>::push_back(buffer,"0123456789abcdef" + local_268);
        }
        else if ((local_26c == local_178) && ((local_268 & local_178) == 0)) {
          local_270[3] = 0x78;
          SmallVectorBase<char>::push_back(buffer,local_270 + 3);
        }
        else if ((local_26c == local_178) && (local_268 == local_178)) {
          local_270[2] = 0x7a;
          SmallVectorBase<char>::push_back(buffer,local_270 + 2);
        }
        else if (((local_268 ^ 0xffffffff) & local_26c) == 0) {
          local_270[0] = 'Z';
          SmallVectorBase<char>::push_back(buffer,local_270);
        }
        else {
          local_270[1] = 0x58;
          SmallVectorBase<char>::push_back(buffer,local_270 + 1);
        }
      }
      lshr(&local_280,(bitwidth_t)&local_30);
      operator=((SVInt *)&local_30,&local_280);
      ~SVInt(&local_280);
      local_248 = local_248 - local_174;
      SVInt<int,void>(&local_298,0);
      local_281 = (uint8_t)operator!=((SVInt *)&local_30,&local_298);
      local_249 = (logic_t)local_281;
      ~SVInt(&local_298);
    }
  }
  uVar1 = mask;
  sVar9 = SmallVectorBase<char>::size(buffer);
  if (uVar1 == sVar9) {
    local_299 = '0';
    SmallVectorBase<char>::push_back(buffer,&local_299);
  }
  else {
    pcVar10 = SmallVectorBase<char>::begin(buffer);
    __first = pcVar10 + mask;
    pcVar10 = SmallVectorBase<char>::end(buffer);
    std::reverse<char*>(__first,pcVar10);
    if (startOffset._4_4_ != 0) {
      local_2b0 = sv("...e",4);
      SmallVectorBase<char>::append<std::basic_string_view<char,std::char_traits<char>>>
                (buffer,&local_2b0);
      uintToStr(buffer,startOffset._4_4_);
    }
  }
  ~SVInt((SVInt *)&local_30);
  return;
}

Assistant:

void SVInt::writeTo(SmallVectorBase<char>& buffer, LiteralBase base, bool includeBase,
                    bitwidth_t abbreviateThresholdBits) const {
    // negative sign if necessary
    SVInt tmp(*this);
    if (signFlag && !unknownFlag && isNegative()) {
        tmp = -tmp;
        buffer.push_back('-');
    }

    // If the number is larger than the threshold to abbreviate,
    // force it to print as a decimal.
    bitwidth_t activeBits = tmp.getActiveBits();
    if (activeBits > abbreviateThresholdBits) {
        includeBase = true;
        base = LiteralBase::Decimal;
    }

    if (includeBase) {
        uintToStr(buffer, bitWidth);
        buffer.push_back('\'');
        if (signFlag)
            buffer.push_back('s');
        switch (base) {
            case LiteralBase::Binary:
                buffer.push_back('b');
                break;
            case LiteralBase::Octal:
                buffer.push_back('o');
                break;
            case LiteralBase::Decimal:
                buffer.push_back('d');
                break;
            case LiteralBase::Hex:
                buffer.push_back('h');
                break;
        }
    }

    uint32_t base10Exponent = 0;
    size_t startOffset = buffer.size();
    static const char Digits[] = "0123456789abcdef";
    if (base == LiteralBase::Decimal) {
        // decimal numbers that have unknown values only print as a single letter,
        // with the following rules:
        // - If all bits are unknown, print 'x'
        // - If all bits are high impendance, print 'z'
        // - If some bits are unknown, print 'X'
        // - Otherwise, if some bits are high impedance , print 'Z'
        if (unknownFlag) {
            uint64_t mask;
            bitwidth_t bitsInMsw;
            uint32_t words = getNumWords(bitWidth, false);
            getTopWordMask(bitsInMsw, mask);

            auto all = [&](uint32_t start, uint64_t v) {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if (pVal[start + i] != v)
                        return false;
                }

                return pVal[start + words - 1] == (mask & v);
            };

            auto anyXs = [&]() {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if ((~pVal[i] & pVal[i + words]) != 0)
                        return true;
                }

                return (~pVal[words - 1] & mask & pVal[words * 2 - 1]) != 0;
            };

            bool upperOnes = all(words, UINT64_MAX);
            if (upperOnes && all(0, UINT64_MAX))
                buffer.push_back('z');
            else if (upperOnes && all(0, 0))
                buffer.push_back('x');
            else if (anyXs())
                buffer.push_back('X');
            else
                buffer.push_back('Z');
        }
        else {
            // Limit the size of the output string based on the given threshold.
            if (activeBits > abbreviateThresholdBits) {
                base10Exponent =
                    std::max(5u, (uint32_t)ceil((activeBits - abbreviateThresholdBits) / log2_10));
                SVInt divisor(bitwidth_t(ceil(base10Exponent * log2_10)), 10, false);
                divisor = divisor.pow(base10Exponent);

                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                tmp = quotient;
            }

            // repeatedly divide by 10 to get each digit
            SVInt divisor(4, 10, false);
            while (tmp != 0) {
                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                uint64_t digit = remainder.as<uint64_t>().value();
                ASSERT(digit < 10);
                buffer.push_back(Digits[digit]);
                tmp = quotient;
            }
        }
    }
    else {
        // for bases 2, 8, and 16 we can just shift instead of dividing
        uint32_t shiftAmount = 0;
        uint32_t maskAmount = 0;
        switch (base) {
            case LiteralBase::Binary:
                shiftAmount = 1;
                maskAmount = 1;
                break;
            case LiteralBase::Octal:
                shiftAmount = 3;
                maskAmount = 7;
                break;
            case LiteralBase::Hex:
                shiftAmount = 4;
                maskAmount = 15;
                break;
            case LiteralBase::Decimal:
                ASSUME_UNREACHABLE;
        }

        // if we have unknown values here, the comparison will return X
        // we want to keep going so that we print the unknowns
        int bitsLeft = int(tmp.getBitWidth());
        logic_t x = tmp != 0;
        while (x || x.isUnknown()) {
            if (bitsLeft < int(shiftAmount))
                maskAmount = (1 << bitsLeft) - 1;

            uint32_t digit = uint32_t(tmp.getRawData()[0]) & maskAmount;
            if (!tmp.unknownFlag)
                buffer.push_back(Digits[digit]);
            else {
                uint32_t u = uint32_t(tmp.pVal[getNumWords(bitWidth, false)]) & maskAmount;
                if (!u)
                    buffer.push_back(Digits[digit]);
                else if (u == maskAmount && (digit & maskAmount) == 0)
                    buffer.push_back('x');
                else if (u == maskAmount && digit == maskAmount)
                    buffer.push_back('z');
                else if (~digit & u)
                    buffer.push_back('X');
                else
                    buffer.push_back('Z');
            }
            // this shift might shift away the unknown digits, at which point
            // it converts back to being a normal 2-state value
            tmp = tmp.lshr(shiftAmount);
            bitsLeft -= int(shiftAmount);
            x = tmp != 0;
        }
    }

    // no digits means this is zero
    if (startOffset == buffer.size())
        buffer.push_back('0');
    else {
        // reverse the digits
        std::reverse(buffer.begin() + startOffset, buffer.end());
        if (base10Exponent > 0) {
            buffer.append("...e"sv);
            uintToStr(buffer, base10Exponent);
        }
    }
}